

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net_processing.cpp
# Opt level: O0

CNodeState * __thiscall
anon_unknown.dwarf_1a1edb::PeerManagerImpl::State(PeerManagerImpl *this,NodeId pnode)

{
  long lVar1;
  CNodeState *pCVar2;
  PeerManagerImpl *in_RSI;
  long in_FS_OFFSET;
  NodeId in_stack_00000008;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  pCVar2 = State(in_RSI,in_stack_00000008);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return pCVar2;
  }
  __stack_chk_fail();
}

Assistant:

CNodeState* PeerManagerImpl::State(NodeId pnode)
{
    return const_cast<CNodeState*>(std::as_const(*this).State(pnode));
}